

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O0

void __thiscall
duckdb::LateMaterialization::ReplaceTableReferences
          (LateMaterialization *this,Expression *expr,idx_t new_table_index)

{
  ExpressionType EVar1;
  BoundColumnRefExpression *pBVar2;
  idx_t in_RDX;
  BaseExpression *in_RSI;
  anon_class_16_2_72cc16af *in_RDI;
  BoundColumnRefExpression *bound_column_ref;
  function<void_(duckdb::Expression_&)> *in_stack_ffffffffffffffa0;
  function<void_(duckdb::Expression_&)> *in_stack_ffffffffffffffc8;
  Expression *in_stack_ffffffffffffffd0;
  
  EVar1 = BaseExpression::GetExpressionType(in_RSI);
  if (EVar1 == BOUND_COLUMN_REF) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                       (&in_stack_ffffffffffffffd0->super_BaseExpression);
    (pBVar2->binding).table_index = in_RDX;
  }
  ::std::function<void(duckdb::Expression&)>::
  function<duckdb::LateMaterialization::ReplaceTableReferences(duckdb::Expression&,unsigned_long)::__0,void>
            (in_stack_ffffffffffffffa0,in_RDI);
  ExpressionIterator::EnumerateChildren(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ::std::function<void_(duckdb::Expression_&)>::~function
            ((function<void_(duckdb::Expression_&)> *)0xd12973);
  return;
}

Assistant:

void LateMaterialization::ReplaceTableReferences(Expression &expr, idx_t new_table_index) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_column_ref = expr.Cast<BoundColumnRefExpression>();
		bound_column_ref.binding.table_index = new_table_index;
	}

	ExpressionIterator::EnumerateChildren(expr,
	                                      [&](Expression &child) { ReplaceTableReferences(child, new_table_index); });
}